

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2501c::GammaMultiplicationModule::Run
          (GammaMultiplicationModule *this,vector<double,_std::allocator<double>_> *input,
          vector<double,_std::allocator<double>_> *output,Buffer *frequency_transform_buffer)

{
  size_type sVar1;
  reference pdVar2;
  reference pdVar3;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *p_Var4;
  iterator __first;
  vector<double,_std::allocator<double>_> *in_RDX;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *this_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  double *local_38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_28 [5];
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar1 != (long)(*(int *)(in_RDI._M_current + 1) + 1)) {
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8._M_current);
  }
  local_28[0]._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  pdVar2 = __gnu_cxx::
           __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(local_28);
  this_00 = (vector<double,_std::allocator<double>_> *)*pdVar2;
  local_30._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(this_00);
  pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_30);
  *pdVar3 = (double)this_00;
  local_40._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(this_00);
  p_Var4 = __gnu_cxx::
           __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator++(&local_40);
  local_38 = p_Var4->_M_current;
  std::vector<double,_std::allocator<double>_>::end(this_00);
  __first = std::vector<double,_std::allocator<double>_>::begin(this_00);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator++
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             &stack0xffffffffffffffa8);
  std::
  transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,(anonymous_namespace)::GammaMultiplicationModule::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,sptk::FrequencyTransform::Buffer*)const::_lambda(double)_1_>
            ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,in_RDI,in_stack_ffffffffffffff98,
             (anon_class_8_1_8991fb9c)in_RDI._M_current);
  return true;
}

Assistant:

bool Run(const std::vector<double>& input, std::vector<double>* output,
           sptk::FrequencyTransform::Buffer* frequency_transform_buffer)
      const override {
    if (output->size() != static_cast<std::size_t>(num_order_ + 1)) {
      output->resize(num_order_ + 1);
    }
    // copy c[0]
    *(output->begin()) = *(input.begin());
    // c[1-m] *= g
    std::transform(++(input.begin()), input.end(), ++(output->begin()),
                   [this](double c) { return c * gamma_; });
    return true;
  }